

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O0

void __thiscall QSignalSpy::appendArgs(QSignalSpy *this,void **a)

{
  long lVar1;
  qsizetype qVar2;
  const_reference piVar3;
  long in_RSI;
  QList<QVariant> *in_RDI;
  long in_FS_OFFSET;
  Type type;
  qsizetype i;
  QList<QVariant> list;
  QMutexLocker<QMutex> locker;
  parameter_type in_stack_ffffffffffffff48;
  QTestEventLoop *in_stack_ffffffffffffff50;
  long local_88;
  QList<QVariant> *this_00;
  QMetaType local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QVariant>::QList((QList<QVariant> *)0x1375aa);
  QList<int>::size((QList<int> *)&in_RDI[2].d.ptr);
  QList<QVariant>::reserve(this_00,in_stack_ffffffffffffffd8);
  local_88 = 0;
  while( true ) {
    qVar2 = QList<int>::size((QList<int> *)&in_RDI[2].d.ptr);
    if (qVar2 <= local_88) break;
    piVar3 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff50,
                            (qsizetype)in_stack_ffffffffffffff48);
    if (*piVar3 == 0x29) {
      QList<QVariant>::operator<<
                ((QList<QVariant> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      QMetaType::QMetaType(&local_60,*piVar3);
      QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,(QMetaType *)local_60.d_ptr,
                         *(void **)(in_RSI + 8 + local_88 * 8));
      QList<QVariant>::operator<<
                ((QList<QVariant> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
    }
    local_88 = local_88 + 1;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff50,(QMutex *)in_stack_ffffffffffffff48);
  QList<QList<QVariant>_>::append
            ((QList<QList<QVariant>_> *)in_stack_ffffffffffffff50,
             (rvalue_ref)in_stack_ffffffffffffff48);
  if ((in_RDI[4].d.size & 1) != 0) {
    QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff50);
    QTestEventLoop::exitLoop(in_stack_ffffffffffffff50);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff50);
  QList<QVariant>::~QList((QList<QVariant> *)0x137777);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalSpy::appendArgs(void **a)
{
    QList<QVariant> list;
    list.reserve(args.size());
    for (qsizetype i = 0; i < args.size(); ++i) {
        const QMetaType::Type type = static_cast<QMetaType::Type>(args.at(i));
        if (type == QMetaType::QVariant)
            list << *reinterpret_cast<QVariant *>(a[i + 1]);
        else
            list << QVariant(QMetaType(type), a[i + 1]);
    }
    QMutexLocker locker(&m_mutex);
    append(std::move(list));

    if (m_waiting) {
        locker.unlock();
        m_loop.exitLoop();
    }
}